

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

void __thiscall
helics::MessageFederateManager::updateTime(MessageFederateManager *this,Time newTime,Time param_2)

{
  SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
  *this_00;
  Endpoint *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  Endpoint **ppEVar3;
  pointer *__ptr;
  long lVar4;
  handle epts;
  InterfaceHandle endpoint_id;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> mcall;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> fid;
  _Head_base<0UL,_helics::Message_*,_false> local_a8;
  handle local_a0;
  handle local_88;
  InterfaceHandle local_6c;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_48;
  
  (this->CurrentTime).internalTimeCode = newTime.internalTimeCode;
  iVar2 = (*this->coreObject->_vptr_Core[0x52])(this->coreObject,(ulong)(uint)(this->fedID).fid);
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 != 0) {
    local_6c.hid = -1700000000;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_a0,&this->mLocalEndpoints);
    gmlc::libguarded::
    atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
    ::load((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
           &local_68,&this->allCallback);
    do {
      (*this->coreObject->_vptr_Core[0x51])
                (&local_a8,this->coreObject,(ulong)(uint)(this->fedID).fid,&local_6c);
      if (local_a8._M_head_impl == (Message *)0x0) break;
      gmlc::containers::
      DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::
      find(&local_48,local_a0.data,&local_6c);
      pEVar1 = local_48.ptr;
      iVar2 = ((local_a0.data)->dataStorage).bsize;
      ppEVar3 = ((local_a0.data)->dataStorage).dataptr;
      if (iVar2 == 0x20) {
        if (ppEVar3 == (Endpoint **)0x0) {
          ppEVar3 = (Endpoint **)
                    &gmlc::containers::
                     StableBlockVector<helics::Endpoint,5u,std::allocator<helics::Endpoint>>::end()
                     ::emptyValue;
        }
        else {
          ppEVar3 = ppEVar3 + (long)((local_a0.data)->dataStorage).dataSlotIndex + 1;
        }
        iVar2 = 0;
      }
      else {
        ppEVar3 = ppEVar3 + ((local_a0.data)->dataStorage).dataSlotIndex;
      }
      if (((ppEVar3 != local_48.vec) &&
          (((local_48.vec == (Endpoint **)0x0 || (*local_48.vec != (Endpoint *)0x0)) ||
           (*ppEVar3 != (Endpoint *)0x0)))) || (iVar2 != local_48.offset)) {
        this_00 = (SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
                   *)(local_48.ptr)->dataReference;
        gmlc::containers::
        SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
        ::emplace<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                  (this_00,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_a8);
        if (*(long *)(this_00 + 0x98) == 0) {
          if (local_58 == (code *)0x0) goto LAB_001e83e3;
          local_a0.data = (pointer)0x0;
          if (local_a0.m_handle_lock._M_owns == false) {
            local_88.data = (pointer)(this->CurrentTime).internalTimeCode;
          }
          else {
            std::unique_lock<std::shared_mutex>::unlock(&local_a0.m_handle_lock);
            local_88.data = (pointer)(this->CurrentTime).internalTimeCode;
            if (local_58 == (code *)0x0) goto LAB_001e842f;
          }
          (*local_50)(&local_68,pEVar1,(TimeRepresentation<count_time<9,_long>_> *)&local_88);
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          ::lock(&local_88,&this->mLocalEndpoints);
        }
        else {
          local_a0.data = (pointer)0x0;
          if (local_a0.m_handle_lock._M_owns == false) {
            local_88.data = (pointer)(this->CurrentTime).internalTimeCode;
          }
          else {
            std::unique_lock<std::shared_mutex>::unlock(&local_a0.m_handle_lock);
            local_88.data = (pointer)(this->CurrentTime).internalTimeCode;
            if (*(long *)(this_00 + 0x98) == 0) {
LAB_001e842f:
              std::__throw_bad_function_call();
            }
          }
          (**(code **)(this_00 + 0xa0))(this_00 + 0x88,pEVar1,&local_88);
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          ::lock(&local_88,&this->mLocalEndpoints);
        }
        local_a0.data = local_88.data;
        std::unique_lock<std::shared_mutex>::operator=
                  (&local_a0.m_handle_lock,&local_88.m_handle_lock);
        std::unique_lock<std::shared_mutex>::~unique_lock(&local_88.m_handle_lock);
      }
LAB_001e83e3:
      if (local_a8._M_head_impl != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_a8,local_a8._M_head_impl);
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    if (local_58 != (code *)0x0) {
      (*local_58)((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_a0.m_handle_lock);
  }
  return;
}

Assistant:

void MessageFederateManager::updateTime(Time newTime, Time /*oldTime*/)
{
    CurrentTime = newTime;
    auto epCount = coreObject->receiveCountAny(fedID);
    if (epCount == 0) {
        return;
    }
    InterfaceHandle endpoint_id;
    auto epts = mLocalEndpoints.lock();
    auto mcall = allCallback.load();
    for (size_t ii = 0; ii < epCount; ++ii) {
        auto message = coreObject->receiveAny(fedID, endpoint_id);
        if (!message) {
            break;
        }

        /** find the id*/
        auto fid = epts->find(endpoint_id);
        if (fid != epts->end()) {  // assign the data

            Endpoint& currentEpt = *fid;
            auto* eData = static_cast<EndpointData*>(fid->dataReference);

            eData->messages.emplace(std::move(message));

            if (eData->callback) {
                // need to be copied otherwise there is a potential race condition on lock removal
                epts.unlock();
                eData->callback(currentEpt, CurrentTime);
                epts = mLocalEndpoints.lock();
            } else if (mcall) {
                epts.unlock();
                mcall(currentEpt, CurrentTime);
                epts = mLocalEndpoints.lock();
            }
        }
    }
}